

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSession::ProcessPolledData(RTPSession *this)

{
  RTPSessionSources *this_00;
  _List_node_base *p_Var1;
  RTCPScheduler *this_01;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  uint32_t ssrc;
  undefined4 extraout_var;
  RTPCollisionList *this_02;
  RTCPCompoundPacket *obj;
  RTCPCompoundPacket *pack;
  RTPTime t;
  RTPTime sendertimeout;
  RTPTime notetimeout;
  RTPTime colltimeout;
  RTPTime byetimeout;
  RTPTime generaltimeout;
  RTCPCompoundPacket *local_90;
  RTPPacketBuilder *local_88;
  RTPTime local_80;
  RTCPScheduler *local_78;
  RTCPPacketBuilder *local_70;
  _List_node_base *local_68;
  RTPTime local_60;
  RTPCollisionList *local_58;
  RTPTime local_50;
  RTPTime local_48;
  RTPTime local_40;
  RTPTime local_38;
  RTPRawPacket *rawpack;
  
  this_00 = &this->sources;
  this_02 = &this->collisionlist;
  local_70 = &this->rtcpbuilder;
  local_68 = (_List_node_base *)&this->byepackets;
  local_78 = &this->rtcpsched;
  local_88 = &this->packetbuilder;
  local_58 = this_02;
  do {
    iVar4 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1f])();
    this_01 = local_78;
    rawpack = (RTPRawPacket *)CONCAT44(extraout_var,iVar4);
    if (rawpack == (RTPRawPacket *)0x0) {
      local_88 = (RTPPacketBuilder *)RTCPScheduler::CalculateDeterministicInterval(local_78,false);
      local_80 = RTPTime::CurrentTime();
      local_60.m_t = this->sendermultiplier * (double)local_88;
      local_38.m_t = this->membermultiplier * (double)local_88;
      local_40.m_t = this->byemultiplier * (double)local_88;
      local_48.m_t = this->collisionmultiplier * (double)local_88;
      local_50.m_t = (double)local_88 * this->notemultiplier;
      RTPSources::MultipleTimeouts
                (&this_00->super_RTPSources,&local_80,&local_60,&local_40,&local_38,&local_50);
      RTPCollisionList::Timeout(this_02,&local_80,&local_48);
      bVar3 = RTCPScheduler::IsTime(this_01);
      p_Var2 = local_68;
      if (!bVar3) {
        return 0;
      }
      p_Var1 = (((_List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                  *)&local_68->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var1 == local_68) {
        iVar4 = RTCPPacketBuilder::BuildNextPacket(local_70,&local_90);
        if (iVar4 < 0) {
          return iVar4;
        }
        iVar4 = SendRTCPData(this,local_90->compoundpacket,local_90->compoundpacketlength);
        if (iVar4 < 0) {
          RTPDelete<jrtplib::RTCPCompoundPacket>(local_90,(this->super_RTPMemoryObject).mgr);
          return iVar4;
        }
        this->sentpackets = true;
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,local_90);
        obj = local_90;
      }
      else {
        obj = (RTCPCompoundPacket *)p_Var1[1]._M_next;
        local_90 = obj;
        std::__cxx11::
        list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::
        pop_front((list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                   *)local_68);
        iVar4 = SendRTCPData(this,obj->compoundpacket,obj->compoundpacketlength);
        if (iVar4 < 0) {
          RTPDelete<jrtplib::RTCPCompoundPacket>(obj,(this->super_RTPMemoryObject).mgr);
          return iVar4;
        }
        this->sentpackets = true;
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,obj);
        p_Var1 = (this->byepackets).
                 super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        if (p_Var1 != p_Var2) {
          RTCPScheduler::ScheduleBYEPacket(this_01,(size_t)p_Var1[1]._M_next[2]._M_next);
        }
      }
      RTCPScheduler::AnalyseOutgoing(this_01,obj);
      RTPDelete<jrtplib::RTCPCompoundPacket>(local_90,(this->super_RTPMemoryObject).mgr);
      return 0;
    }
    if ((this->m_changeIncomingData != true) ||
       (iVar4 = (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x17])(this,rawpack),
       (char)iVar4 != '\0')) {
      (this->sources).owncollision = false;
      iVar4 = RTPSources::ProcessRawPacket
                        (&this_00->super_RTPSources,rawpack,this->rtptrans,this->acceptownpackets);
      if (iVar4 < 0) {
LAB_0012343d:
        RTPDelete<jrtplib::RTPRawPacket>(rawpack,(this->super_RTPMemoryObject).mgr);
        return iVar4;
      }
      if ((this->sources).owncollision == true) {
        local_80.m_t = (rawpack->receivetime).m_t;
        iVar4 = RTPCollisionList::UpdateAddress
                          (this_02,rawpack->senderaddress,&local_80,(bool *)&local_60);
        if (iVar4 < 0) goto LAB_0012343d;
        if (local_60.m_t._0_1_ == '\x01') {
          if (this->sentpackets == true) {
            iVar4 = RTCPPacketBuilder::BuildBYEPacket
                              (local_70,(RTCPCompoundPacket **)&local_80,(void *)0x0,0,
                               this->useSR_BYEifpossible);
            if (iVar4 < 0) goto LAB_0012343d;
            std::__cxx11::
            list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::
            push_back((list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                       *)local_68,(value_type *)&local_80);
            if ((this->byepackets).
                super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                ._M_impl._M_node._M_size == 1) {
              RTCPScheduler::ScheduleBYEPacket(local_78,*(size_t *)((long)local_80.m_t + 0x20));
            }
          }
          ssrc = RTPPacketBuilder::CreateNewSSRC(local_88,&this_00->super_RTPSources);
          this->sentpackets = false;
          iVar4 = RTPSources::DeleteOwnSSRC(&this_00->super_RTPSources);
          if ((iVar4 < 0) ||
             (iVar4 = RTPSources::CreateOwnSSRC(&this_00->super_RTPSources,ssrc), this_02 = local_58
             , iVar4 < 0)) goto LAB_0012343d;
        }
      }
    }
    RTPDelete<jrtplib::RTPRawPacket>(rawpack,(this->super_RTPMemoryObject).mgr);
  } while( true );
}

Assistant:

int RTPSession::ProcessPolledData()
{
	RTPRawPacket *rawpack;
	int status;
	
	SOURCES_LOCK
	while ((rawpack = rtptrans->GetNextPacket()) != 0)
	{
		if (m_changeIncomingData)
		{
			// Provide a way to change incoming data, for decryption for example
			if (!OnChangeIncomingData(rawpack))
			{
				RTPDelete(rawpack,GetMemoryManager());
				continue;
			}
		}

		sources.ClearOwnCollisionFlag();

		// since our sources instance also uses the scheduler (analysis of incoming packets)
		// we'll lock it
		SCHED_LOCK
		if ((status = sources.ProcessRawPacket(rawpack,rtptrans,acceptownpackets)) < 0)
		{
			SCHED_UNLOCK
			SOURCES_UNLOCK
			RTPDelete(rawpack,GetMemoryManager());
			return status;
		}
		SCHED_UNLOCK
				
		if (sources.DetectedOwnCollision()) // collision handling!
		{
			bool created;
			
			if ((status = collisionlist.UpdateAddress(rawpack->GetSenderAddress(),rawpack->GetReceiveTime(),&created)) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(rawpack,GetMemoryManager());
				return status;
			}

			if (created) // first time we've encountered this address, send bye packet and
			{            // change our own SSRC
				PACKSENT_LOCK
				bool hassentpackets = sentpackets;
				PACKSENT_UNLOCK

				if (hassentpackets)
				{
					// Only send BYE packet if we've actually sent data using this
					// SSRC
					
					RTCPCompoundPacket *rtcpcomppack;

					BUILDER_LOCK
					if ((status = rtcpbuilder.BuildBYEPacket(&rtcpcomppack,0,0,useSR_BYEifpossible)) < 0)
					{
						BUILDER_UNLOCK
						SOURCES_UNLOCK
						RTPDelete(rawpack,GetMemoryManager());
						return status;
					}
					BUILDER_UNLOCK

					byepackets.push_back(rtcpcomppack);
					if (byepackets.size() == 1) // was the first packet, schedule a BYE packet (otherwise there's already one scheduled)
					{
						SCHED_LOCK
						rtcpsched.ScheduleBYEPacket(rtcpcomppack->GetCompoundPacketLength());
						SCHED_UNLOCK
					}
				}
				// bye packet is built and scheduled, now change our SSRC
				// and reset the packet count in the transmitter
				
				BUILDER_LOCK
				uint32_t newssrc = packetbuilder.CreateNewSSRC(sources);
				BUILDER_UNLOCK
					
				PACKSENT_LOCK
				sentpackets = false;
				PACKSENT_UNLOCK
	
				// remove old entry in source table and add new one

				if ((status = sources.DeleteOwnSSRC()) < 0)
				{
					SOURCES_UNLOCK
					RTPDelete(rawpack,GetMemoryManager());
					return status;
				}
				if ((status = sources.CreateOwnSSRC(newssrc)) < 0)
				{
					SOURCES_UNLOCK
					RTPDelete(rawpack,GetMemoryManager());
					return status;
				}
			}
		}
		RTPDelete(rawpack,GetMemoryManager());
	}

	SCHED_LOCK
	RTPTime d = rtcpsched.CalculateDeterministicInterval(false);
	SCHED_UNLOCK
	
	RTPTime t = RTPTime::CurrentTime();
	double Td = d.GetDouble();
	RTPTime sendertimeout = RTPTime(Td*sendermultiplier);
	RTPTime generaltimeout = RTPTime(Td*membermultiplier);
	RTPTime byetimeout = RTPTime(Td*byemultiplier);
	RTPTime colltimeout = RTPTime(Td*collisionmultiplier);
	RTPTime notetimeout = RTPTime(Td*notemultiplier);
	
	sources.MultipleTimeouts(t,sendertimeout,byetimeout,generaltimeout,notetimeout);
	collisionlist.Timeout(t,colltimeout);
	
	// We'll check if it's time for RTCP stuff

	SCHED_LOCK
	bool istime = rtcpsched.IsTime();
	SCHED_UNLOCK
	
	if (istime)
	{
		RTCPCompoundPacket *pack;
	
		// we'll check if there's a bye packet to send, or just a normal packet

		if (byepackets.empty())
		{
			BUILDER_LOCK
			if ((status = rtcpbuilder.BuildNextPacket(&pack)) < 0)
			{
				BUILDER_UNLOCK
				SOURCES_UNLOCK
				return status;
			}
			BUILDER_UNLOCK
			if ((status = SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength())) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(pack,GetMemoryManager());
				return status;
			}
		
			PACKSENT_LOCK
			sentpackets = true;
			PACKSENT_UNLOCK

			OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
		}
		else
		{
			pack = *(byepackets.begin());
			byepackets.pop_front();
			
			if ((status = SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength())) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(pack,GetMemoryManager());
				return status;
			}
			
			PACKSENT_LOCK
			sentpackets = true;
			PACKSENT_UNLOCK

			OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
			
			if (!byepackets.empty()) // more bye packets to send, schedule them
			{
				SCHED_LOCK
				rtcpsched.ScheduleBYEPacket((*(byepackets.begin()))->GetCompoundPacketLength());
				SCHED_UNLOCK
			}
		}
		
		SCHED_LOCK
		rtcpsched.AnalyseOutgoing(*pack);
		SCHED_UNLOCK

		RTPDelete(pack,GetMemoryManager());
	}
	SOURCES_UNLOCK
	return 0;
}